

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeArrayBulkMemoryOp(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  value_type type_00;
  char cVar1;
  uint32_t uVar2;
  value_type *pvVar3;
  Expression *pEVar4;
  Expression *ref;
  Expression *pEVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  Expression *pEVar10;
  undefined1 local_a0 [8];
  BoundsCheck srcCheck;
  value_type arrayType;
  BoundsCheck check;
  value_type srcArrayType;
  
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x13d7,"Expression *wasm::TranslateToFuzzReader::makeArrayBulkMemoryOp(Type)");
  }
  if ((this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &this->random;
    pvVar3 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this_00,&this->mutableArrays);
    srcCheck.getLength = (Expression *)pvVar3->id;
    wasm::HeapType::getArray();
    type_00 = arrayType;
    pEVar4 = make(this,(Type)0x2);
    ref = makeTrappingRefUse(this,(HeapType)srcCheck.getLength);
    uVar2 = Random::upTo(this_00,2);
    if (uVar2 == 0) {
      pEVar5 = make(this,(Type)type_00.id);
      pEVar6 = make(this,(Type)0x2);
      if ((this->allowOOB == true) && (uVar2 = Random::upTo(this_00,10), uVar2 == 0)) {
        pEVar7 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x30,8);
        pEVar7->_id = ArrayFillId;
        (pEVar7->type).id = 0;
        *(Expression **)(pEVar7 + 1) = ref;
        pEVar7[1].type.id = (uintptr_t)pEVar4;
        *(Expression **)(pEVar7 + 2) = pEVar5;
        pEVar7[2].type.id = (uintptr_t)pEVar6;
        wasm::ArrayFill::finalize();
        return pEVar7;
      }
      makeArrayBoundsCheck
                ((BoundsCheck *)&arrayType,ref,pEVar4,this->funcContext->func,&this->builder,pEVar6)
      ;
      puVar8 = (undefined1 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x30,8);
      *puVar8 = 0x4e;
      *(undefined8 *)(puVar8 + 8) = 0;
      *(ulong *)(puVar8 + 0x10) = CONCAT44(check.condition._4_4_,check.condition._0_4_);
      *(Expression **)(puVar8 + 0x18) = check.getRef;
      *(Expression **)(puVar8 + 0x20) = pEVar5;
      *(Expression **)(puVar8 + 0x28) = check.getIndex;
      wasm::ArrayFill::finalize();
      pEVar4 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
      pEVar4->_id = IfId;
      (pEVar4->type).id = 0;
      *(undefined8 *)(pEVar4 + 2) = 0;
      *(uintptr_t *)(pEVar4 + 1) = arrayType.id;
      pEVar4[1].type.id = (uintptr_t)puVar8;
    }
    else {
      pvVar3 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this_00,&this->mutableArrays);
      check.getLength = (Expression *)pvVar3->id;
      wasm::HeapType::getArray();
      cVar1 = wasm::Type::isSubType((Type)arrayType.id,(Type)type_00.id);
      if (cVar1 == '\0') {
        check.getLength = srcCheck.getLength;
      }
      pEVar5 = make(this,(Type)0x2);
      pEVar6 = makeTrappingRefUse(this,(HeapType)check.getLength);
      pEVar7 = make(this,(Type)0x2);
      if ((this->allowOOB == true) && (uVar2 = Random::upTo(this_00,10), uVar2 == 0)) {
        pEVar10 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x38,8);
        pEVar10->_id = ArrayCopyId;
        (pEVar10->type).id = 0;
        *(Expression **)(pEVar10 + 1) = ref;
        pEVar10[1].type.id = (uintptr_t)pEVar4;
        *(Expression **)(pEVar10 + 2) = pEVar6;
        pEVar10[2].type.id = (uintptr_t)pEVar5;
        *(Expression **)(pEVar10 + 3) = pEVar7;
        wasm::ArrayCopy::finalize();
        return pEVar10;
      }
      makeArrayBoundsCheck
                ((BoundsCheck *)&arrayType,ref,pEVar4,this->funcContext->func,&this->builder,pEVar7)
      ;
      makeArrayBoundsCheck
                ((BoundsCheck *)local_a0,pEVar6,pEVar5,this->funcContext->func,&this->builder,
                 check.getIndex);
      puVar8 = (undefined1 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x38,8);
      *puVar8 = 0x4d;
      *(undefined8 *)(puVar8 + 8) = 0;
      *(ulong *)(puVar8 + 0x10) = CONCAT44(check.condition._4_4_,check.condition._0_4_);
      *(Expression **)(puVar8 + 0x18) = check.getRef;
      *(Expression **)(puVar8 + 0x20) = srcCheck.condition;
      *(Expression **)(puVar8 + 0x28) = srcCheck.getRef;
      *(Expression **)(puVar8 + 0x30) = srcCheck.getIndex;
      wasm::ArrayCopy::finalize();
      puVar9 = (undefined1 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
      *puVar9 = 2;
      *(undefined8 *)(puVar9 + 8) = 0;
      *(undefined8 *)(puVar9 + 0x20) = 0;
      *(undefined1 (*) [8])(puVar9 + 0x10) = local_a0;
      *(undefined1 **)(puVar9 + 0x18) = puVar8;
      wasm::If::finalize(puVar9);
      pEVar4 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
      pEVar4->_id = IfId;
      (pEVar4->type).id = 0;
      *(undefined8 *)(pEVar4 + 2) = 0;
      *(uintptr_t *)(pEVar4 + 1) = arrayType.id;
      pEVar4[1].type.id = (uintptr_t)puVar9;
    }
    wasm::If::finalize(pEVar4);
    return pEVar4;
  }
  pEVar4 = makeTrivial(this,(Type)0x0);
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeArrayBulkMemoryOp(Type type) {
  assert(type == Type::none);
  if (mutableArrays.empty()) {
    return makeTrivial(type);
  }
  auto arrayType = pick(mutableArrays);
  auto element = arrayType.getArray().element;
  auto* index = make(Type::i32);
  auto* ref = makeTrappingRefUse(arrayType);
  if (oneIn(2)) {
    // ArrayFill
    auto* value = make(element.type);
    auto* length = make(Type::i32);
    // Only rarely emit a plain get which might trap. See related logic in
    // ::makePointer().
    if (allowOOB && oneIn(10)) {
      return builder.makeArrayFill(ref, index, value, length);
    }
    auto check =
      makeArrayBoundsCheck(ref, index, funcContext->func, builder, length);
    auto* fill = builder.makeArrayFill(
      check.getRef, check.getIndex, value, check.getLength);
    return builder.makeIf(check.condition, fill);
  } else {
    // ArrayCopy. Here we must pick a source array whose element type is a
    // subtype of the destination.
    auto srcArrayType = pick(mutableArrays);
    auto srcElement = srcArrayType.getArray().element;
    if (!Type::isSubType(srcElement.type, element.type) ||
        element.packedType != srcElement.packedType) {
      // TODO: A matrix of which arrays are subtypes of others. For now, if we
      // didn't get what we want randomly, just copy from the same type to
      // itself.
      srcArrayType = arrayType;
      srcElement = element;
    }
    auto* srcIndex = make(Type::i32);
    auto* srcRef = makeTrappingRefUse(srcArrayType);
    auto* length = make(Type::i32);
    if (allowOOB && oneIn(10)) {
      return builder.makeArrayCopy(ref, index, srcRef, srcIndex, length);
    }
    auto check =
      makeArrayBoundsCheck(ref, index, funcContext->func, builder, length);
    auto srcCheck = makeArrayBoundsCheck(
      srcRef, srcIndex, funcContext->func, builder, check.getLength);
    auto* copy = builder.makeArrayCopy(check.getRef,
                                       check.getIndex,
                                       srcCheck.getRef,
                                       srcCheck.getIndex,
                                       srcCheck.getLength);
    return builder.makeIf(check.condition,
                          builder.makeIf(srcCheck.condition, copy));
  }
}